

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib541.c
# Opt level: O0

int test(char *URL)

{
  uint uVar1;
  FILE *__stream;
  int iVar2;
  FILE *pFVar3;
  uint *puVar4;
  char *pcVar5;
  long lVar6;
  undefined1 local_c8 [4];
  int error;
  stat file_info;
  int hd;
  FILE *hd_src;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  if (libtest_arg2 == (char *)0x0) {
    fprintf(_stderr,"Usage: <url> <file-to-upload>\n");
    URL_local._4_4_ = -1;
  }
  else {
    pFVar3 = fopen64(libtest_arg2,"rb");
    if (pFVar3 == (FILE *)0x0) {
      puVar4 = (uint *)__errno_location();
      pFVar3 = _stderr;
      uVar1 = *puVar4;
      pcVar5 = strerror(uVar1);
      fprintf(pFVar3,"fopen() failed with error: %d %s\n",(ulong)uVar1,pcVar5);
      fprintf(_stderr,"Error opening file: %s\n",libtest_arg2);
      URL_local._4_4_ = -2;
    }
    else {
      iVar2 = fileno(pFVar3);
      file_info.__glibc_reserved[2]._4_4_ = fstat64(iVar2,(stat64 *)local_c8);
      if (file_info.__glibc_reserved[2]._4_4_ == -1) {
        puVar4 = (uint *)__errno_location();
        __stream = _stderr;
        uVar1 = *puVar4;
        pcVar5 = strerror(uVar1);
        fprintf(__stream,"fstat() failed with error: %d %s\n",(ulong)uVar1,pcVar5);
        fprintf(_stderr,"ERROR: cannot open file %s\n",libtest_arg2);
        fclose(pFVar3);
        URL_local._4_4_ = -1;
      }
      else if (file_info.st_rdev == 0) {
        fprintf(_stderr,"ERROR: file %s has zero size!\n",libtest_arg2);
        fclose(pFVar3);
        URL_local._4_4_ = -4;
      }
      else {
        iVar2 = curl_global_init(3);
        if (iVar2 == 0) {
          lVar6 = curl_easy_init();
          if (lVar6 == 0) {
            fprintf(_stderr,"curl_easy_init() failed\n");
            curl_global_cleanup();
            fclose(pFVar3);
            URL_local._4_4_ = 0x7e;
          }
          else {
            hd_src._4_4_ = curl_easy_setopt(lVar6,0x2e,1);
            if ((((hd_src._4_4_ == 0) &&
                 (hd_src._4_4_ = curl_easy_setopt(lVar6,0x29,1), hd_src._4_4_ == 0)) &&
                (hd_src._4_4_ = curl_easy_setopt(lVar6,0x2712,URL), hd_src._4_4_ == 0)) &&
               (hd_src._4_4_ = curl_easy_setopt(lVar6,0x2719,pFVar3), hd_src._4_4_ == 0)) {
              curl_easy_perform(lVar6);
              hd_src._4_4_ = curl_easy_perform(lVar6);
            }
            fclose(pFVar3);
            curl_easy_cleanup(lVar6);
            curl_global_cleanup();
            URL_local._4_4_ = hd_src._4_4_;
          }
        }
        else {
          fprintf(_stderr,"curl_global_init() failed\n");
          fclose(pFVar3);
          URL_local._4_4_ = 0x7e;
        }
      }
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src ;
  int hd ;
  struct_stat file_info;
  int error;

  if (!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return -1;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return -2; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return -1;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return -4;
  }

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl,CURLOPT_URL, URL);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_INFILE, hd_src);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

  /* and now upload the exact same again, but without rewinding so it already
     is at end of file */
  res = curl_easy_perform(curl);

test_cleanup:

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}